

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layers.h
# Opt level: O3

void __thiscall
dlib::con_<64l,7l,7l,2,2,0,0>::
backward<dlib::add_layer<dlib::con_<64l,7l,7l,2,2,0,0>,dlib::input_rgb_image,void>::subnet_wrapper>
          (con_<64l,7l,7l,2,2,0,0> *this,tensor *gradient_input,subnet_wrapper *sub,
          tensor *params_grad)

{
  tensor *data_gradient;
  alias_tensor_instance filt;
  alias_tensor_instance b;
  alias_tensor_instance local_c0;
  alias_tensor_instance local_78;
  
  alias_tensor::operator()(&local_c0,(alias_tensor *)(this + 0x98),(tensor *)this,0);
  data_gradient =
       add_layer<dlib::con_<64L,_7L,_7L,_2,_2,_0,_0>,_dlib::input_rgb_image,_void>::subnet_wrapper::
       get_gradient_input(sub);
  cpu::tensor_conv::get_gradient_for_data
            ((tensor_conv *)(this + 0x128),true,gradient_input,&local_c0.super_tensor,data_gradient)
  ;
  if ((*(double *)(this + 0x148) != 0.0) || (NAN(*(double *)(this + 0x148)))) {
    alias_tensor::operator()(&local_c0,(alias_tensor *)(this + 0x98),params_grad,0);
    cpu::tensor_conv::get_gradient_for_filters
              ((tensor_conv *)(this + 0x128),false,gradient_input,sub->x,&local_c0.super_tensor);
    if (this[0x178] == (con_<64l,7l,7l,2,2,0,0>)0x1) {
      alias_tensor::operator()
                (&local_78,(alias_tensor *)(this + 0xe0),params_grad,*(size_t *)(this + 0xc0));
      tt::assign_conv_bias_gradient(&local_78.super_tensor,gradient_input);
    }
  }
  return;
}

Assistant:

void backward(const tensor& gradient_input, SUBNET& sub, tensor& params_grad)
        {
            conv.get_gradient_for_data (true, gradient_input, filters(params,0), sub.get_gradient_input());
            // no point computing the parameter gradients if they won't be used.
            if (learning_rate_multiplier != 0)
            {
                auto filt = filters(params_grad,0);
                conv.get_gradient_for_filters (false, gradient_input, sub.get_output(), filt);
                if (use_bias)
                {
                    auto b = biases(params_grad, filters.size());
                    tt::assign_conv_bias_gradient(b, gradient_input);
                }
            }
        }